

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool IsImage(ctmbstr iType)

{
  Bool BVar1;
  int iVar2;
  tmbchar local_38 [8];
  tmbchar ext [20];
  uint local_1c;
  uint i;
  ctmbstr iType_local;
  
  BVar1 = IsFilePath(iType);
  if (BVar1 != no) {
    GetFileExtension(iType,local_38,0x14);
    for (local_1c = 0; local_1c < 0xd; local_1c = local_1c + 1) {
      iVar2 = prvTidytmbstrcasecmp(local_38,imageExtensions[local_1c]);
      if (iVar2 == 0) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

static Bool IsImage( ctmbstr iType )
{
    uint i;
    tmbchar ext[20];

    if ( !IsFilePath(iType) ) return 0;

    GetFileExtension( iType, ext, sizeof(ext) );

    /* Compare it to the array of known image file extensions */
    for (i = 0; i < N_IMAGE_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, imageExtensions[i]) == 0 )
            return yes;
    }
    
    return no;
}